

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O2

JavascriptString *
Js::LiteralStringWithPropertyStringPtr::NewFromWideString
          (char16 *wideString,CharCount charCount,JavascriptLibrary *library)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LiteralStringWithPropertyStringPtr *this;
  JavascriptString *pJVar4;
  Recycler *pRVar5;
  char16_t *dst;
  ulong sizeInWords;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (wideString == (char16 *)0x0 || library == (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x20,"(library != nullptr && wideString != nullptr)",
                                "library != nullptr && wideString != nullptr");
    if (!bVar2) goto LAB_00a0b435;
    *puVar3 = 0;
  }
  if (charCount == 1) {
    pJVar4 = CharStringCache::GetStringForChar(&library->charStringCache,*wideString);
    return pJVar4;
  }
  if (charCount == 0) {
    this = (LiteralStringWithPropertyStringPtr *)JavascriptLibrary::GetEmptyString(library);
    if ((this->super_LiteralString).super_JavascriptString.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
        (_func_int **)VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::Address) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                  ,0x28,
                                  "(VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::HasVirtualTable(emptyString))"
                                  ,
                                  "Library::GetEmptyString is no longer LiteralStringWithPropertyStringPtr ?"
                                 );
      if (!bVar2) {
LAB_00a0b435:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  else {
    scriptContext = (library->super_JavascriptLibraryBase).scriptContext.ptr;
    local_58 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_5ff2f34;
    data.filename._0_4_ = 0x35;
    data.plusSize = (ulong)(charCount + 1);
    pRVar5 = Memory::Recycler::TrackAllocInfo(library->recycler,(TrackAllocData *)local_58);
    dst = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                    ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                     (ulong)(charCount + 1));
    if (dst == (char16_t *)0x0) {
      JavascriptError::ThrowOutOfMemoryError(scriptContext);
    }
    sizeInWords = (ulong)charCount;
    js_wmemcpy_s(dst,sizeInWords,wideString,sizeInWords);
    dst[sizeInWords] = L'\0';
    local_58 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_5ff2f34;
    data.filename._0_4_ = 0x3f;
    pRVar5 = Memory::Recycler::TrackAllocInfo(library->recycler,(TrackAllocData *)local_58);
    this = (LiteralStringWithPropertyStringPtr *)new<Memory::Recycler>(0x30,pRVar5,0x37a1d4);
    LiteralStringWithPropertyStringPtr(this,dst,charCount,library);
  }
  return (JavascriptString *)this;
}

Assistant:

JavascriptString * LiteralStringWithPropertyStringPtr::
    NewFromWideString(const char16 * wideString, const CharCount charCount, JavascriptLibrary *const library)
    {
        Assert(library != nullptr && wideString != nullptr);

        switch (charCount)
        {
            case 0:
            {
                JavascriptString * emptyString = library->GetEmptyString();
                AssertMsg(VirtualTableInfo<Js::LiteralStringWithPropertyStringPtr>::HasVirtualTable(emptyString),
                    "Library::GetEmptyString is no longer LiteralStringWithPropertyStringPtr ?");
                return emptyString;
            }
            case 1:
            {
                return library->GetCharStringCache().GetStringForChar((char16(*wideString)));
            }
            default:
                break;
        }

        Recycler * recycler = library->GetRecycler();
        ScriptContext * scriptContext = library->GetScriptContext();
        char16* destString = RecyclerNewArrayLeaf(recycler, WCHAR, charCount + 1);

        if (destString == nullptr)
        {
            Js::JavascriptError::ThrowOutOfMemoryError(scriptContext);
        }

        js_wmemcpy_s(destString, charCount, wideString, charCount);
        destString[charCount] = char16(0);

        return (JavascriptString*) RecyclerNew(library->GetRecycler(), LiteralStringWithPropertyStringPtr, destString, charCount, library);
    }